

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coop.c
# Opt level: O1

void thread_switch(Thread *from,Thread *to)

{
  Sched *pSVar1;
  
  pSVar1 = from->sched;
  if (pSVar1->running == from) {
    if (the_thread == from) {
      if (pSVar1->fuel != 0) {
        pSVar1->fuel = pSVar1->fuel - 1;
      }
      pSVar1->running = to;
      the_thread = to;
      fiber_switch(&from->fiber,&to->fiber);
      return;
    }
  }
  else {
    thread_switch_cold_1();
  }
  thread_switch_cold_2();
  fprintf((FILE *)out,"%s\n",from->sched);
  return;
}

Assistant:

static void
thread_switch(Thread *from, Thread *to)
{
    Sched *sched = from->sched;
    require(sched->running == from);
    require(the_thread == from);

    if (sched->fuel > 0)
        --sched->fuel;

    sched->running = to;
    the_thread = to;
    fiber_switch(thread_fiber(from), thread_fiber(to));
}